

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dconnected.cpp
# Opt level: O3

void __thiscall
DReachabilityPropagator::reverseDFStoBorder
          (DReachabilityPropagator *this,int u,vector<bool,_std::allocator<bool>_> *v,
          vector<bool,_std::allocator<bool>_> *my_side,vec<Lit> *expl,int skip_n)

{
  ulong *puVar1;
  uint uVar2;
  BoolView *pBVar3;
  int iVar4;
  ulong uVar5;
  pointer pvVar6;
  int iVar7;
  uint *puVar8;
  Lit local_5c;
  vec<Lit> *local_58;
  vector<bool,_std::allocator<bool>_> *local_50;
  vector<bool,_std::allocator<bool>_> *local_48;
  ulong local_40;
  uint *local_38;
  
  uVar5 = (ulong)u;
  iVar4 = u + 0x3f;
  if (-1 < u) {
    iVar4 = u;
  }
  puVar1 = (v->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data._M_start
           .super__Bit_iterator_base._M_p +
           (long)(iVar4 >> 6) +
           (ulong)((uVar5 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff;
  *puVar1 = *puVar1 | 1L << ((byte)u & 0x3f);
  pvVar6 = (this->in).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar8 = *(uint **)&pvVar6[uVar5].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data;
  local_38 = (uint *)pvVar6[uVar5].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
  if (puVar8 != local_38) {
    local_40 = 0x800000000000003f;
    local_58 = expl;
    local_50 = v;
    local_48 = my_side;
    do {
      uVar2 = *puVar8;
      pBVar3 = (this->super_GraphPropagator).es.data;
      if (sat.assigns.data[(uint)pBVar3[uVar2].v] == 0) {
        pvVar6 = (this->super_GraphPropagator).endnodes.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
LAB_001ce83c:
        iVar4 = *pvVar6[(int)uVar2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (iVar4 != skip_n) {
          iVar7 = iVar4 + 0x3f;
          if (-1 < iVar4) {
            iVar7 = iVar4;
          }
          if (((v->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
               _M_start.super__Bit_iterator_base._M_p
               [(long)(iVar7 >> 6) +
                (ulong)(((long)iVar4 & local_40) < 0x8000000000000001) + 0xffffffffffffffff] >>
               ((long)iVar4 & 0x3fU) & 1) == 0) {
            reverseDFStoBorder(this,iVar4,v,local_48,local_58,skip_n);
          }
        }
      }
      else {
        pvVar6 = (this->super_GraphPropagator).endnodes.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((uint)pBVar3[uVar2].s * 2 + -1 != (int)sat.assigns.data[(uint)pBVar3[uVar2].v])
        goto LAB_001ce83c;
        iVar4 = (*(this->lt->super_LengauerTarjan)._vptr_LengauerTarjan[7])
                          (this->lt,(ulong)**(uint **)&pvVar6[(int)uVar2].
                                                       super__Vector_base<int,_std::allocator<int>_>
                                                       ._M_impl.super__Vector_impl_data);
        v = local_50;
        pvVar6 = (this->super_GraphPropagator).endnodes.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((char)iVar4 == '\0') goto LAB_001ce83c;
        iVar4 = *pvVar6[(int)uVar2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar5 = (ulong)iVar4;
        iVar7 = iVar4 + 0x3f;
        if (-1 < (long)uVar5) {
          iVar7 = iVar4;
        }
        if (((local_48->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data
             ._M_start.super__Bit_iterator_base._M_p
             [(long)(iVar7 >> 6) +
              (ulong)((uVar5 & local_40) < 0x8000000000000001) + 0xffffffffffffffff] >>
             (uVar5 & 0x3f) & 1) != 0) goto LAB_001ce83c;
        uVar2 = (this->super_GraphPropagator).es.data[uVar2].v;
        local_5c.x = (uint)((int)sat.assigns.data[uVar2] - 1U < 0xfffffffd) + uVar2 * 2;
        vec<Lit>::push(local_58,&local_5c);
      }
      puVar8 = puVar8 + 1;
    } while (puVar8 != local_38);
  }
  return;
}

Assistant:

void DReachabilityPropagator::reverseDFStoBorder(int u, std::vector<bool>& v,
																								 std::vector<bool>& my_side, vec<Lit>& expl,
																								 int skip_n) {
	if (DEBUG) {
		std::cout << "Reverse DFS to border from " << u << '\n';
	}
	v[u] = true;
	for (const int ie : in[u]) {
		if (getEdgeVar(ie).isFixed() && getEdgeVar(ie).isFalse() && lt->visited_dfs(getTail(ie)) &&
				!my_side[getTail(ie)]) {
			expl.push(getEdgeVar(ie).getValLit());
			if (DEBUG) {
				std::cout << "Added to explanation for dom/bridge edge:" << ie << '\n';
			}
		} else {
			const int o = getTail(ie);
			if (o == skip_n || v[o]) {
				continue;
			}
			reverseDFStoBorder(o, v, my_side, expl, skip_n);
		}
	}
}